

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O0

void __thiscall Wall::do_finish(Wall *this,actor_ref *param_1,msg_finish *param_2)

{
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  char local_128 [8];
  char buffer [255];
  msg_finish *param_2_local;
  actor_ref *param_1_local;
  Wall *this_local;
  
  this->m_finished = true;
  snprintf(local_128,0xff,"Counter : %d",(ulong)(uint)this->m_counter);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,local_128,&local_149);
  acto::actor_ref::send<msg_out,std::__cxx11::string>(&this->m_console,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  acto::actor::die(&this->super_actor);
  return;
}

Assistant:

void do_finish(acto::actor_ref, const msg_finish&) {
    m_finished = true;
    // -
    char    buffer[255];

    std::snprintf(buffer, sizeof(buffer), "Counter : %d", (int)m_counter);
    // Отправить сообщение на консоль
    m_console.send< msg_out >(std::string(buffer));
    // Завершить выполнение текущего актера
    this->die();
  }